

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunctionType.cpp
# Opt level: O0

void __thiscall
Js::ScriptFunctionType::ChangeEntryPoint
          (ScriptFunctionType *this,ProxyEntryPointInfo *entryPointInfo,JavascriptMethod entryPoint,
          bool isAsmJS)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptMethod p_Var4;
  ProxyEntryPointInfo *pPVar5;
  ProxyEntryPointInfo *oldEntryPointInfo;
  bool isAsmJS_local;
  JavascriptMethod entryPoint_local;
  ProxyEntryPointInfo *entryPointInfo_local;
  ScriptFunctionType *this_local;
  
  if (entryPoint == (JavascriptMethod)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ScriptFunctionType.cpp"
                                ,0x31,"(entryPoint != nullptr)","entryPoint != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (entryPointInfo == (ProxyEntryPointInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ScriptFunctionType.cpp"
                                ,0x32,"(entryPointInfo != nullptr)","entryPointInfo != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  p_Var4 = Js::Type::GetEntryPoint((Type *)this);
  if ((p_Var4 != entryPoint) || (pPVar5 = GetEntryPointInfo(this), pPVar5 != entryPointInfo)) {
    if (isAsmJS) {
      entryPointInfo->jsMethod = (Type)entryPoint;
    }
    else {
      p_Var4 = Js::Type::GetEntryPoint((Type *)this);
      bVar2 = CrossSite::IsThunk(p_Var4);
      if (!bVar2) {
        DynamicType::SetEntryPoint(&this->super_DynamicType,entryPoint);
      }
    }
    pPVar5 = GetEntryPointInfo(this);
    ScriptFunction::CopyEntryPointInfoToThreadContextIfNecessary(pPVar5,entryPointInfo);
    SetEntryPointInfo(this,entryPointInfo);
  }
  return;
}

Assistant:

void ScriptFunctionType::ChangeEntryPoint(ProxyEntryPointInfo * entryPointInfo, JavascriptMethod entryPoint, bool isAsmJS)
    {
        Assert(entryPoint != nullptr);
        Assert(entryPointInfo != nullptr);
        if (this->GetEntryPoint() == entryPoint && this->GetEntryPointInfo() == entryPointInfo)
        {
            return;
        }

        // ASMJS:- for asmjs we don't need to update the entry point here as it updates the types entry point
        if (!isAsmJS)
        {
            // We can't go from cross-site to non-cross-site. Update only in the non-cross site case
            if (!CrossSite::IsThunk(this->GetEntryPoint()))
            {
                this->SetEntryPoint(entryPoint);
            }
        }
        // instead update the address in the function entrypoint info
        else
        {
            entryPointInfo->jsMethod = entryPoint;
        }

        ProxyEntryPointInfo* oldEntryPointInfo = this->GetEntryPointInfo();
        ScriptFunction::CopyEntryPointInfoToThreadContextIfNecessary(oldEntryPointInfo, entryPointInfo);

        this->SetEntryPointInfo(entryPointInfo);
    }